

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

int Wln_RetPropDelay_rec(Wln_Ret_t *p,int iObj)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  Wln_Ntk_t *pWVar5;
  int iVar6;
  Wln_Vec_t *pWVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  
  if ((iObj < 0) || ((p->vPathDelays).nSize <= iObj)) {
LAB_0036511c:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar2 = (p->vPathDelays).pArray;
  iVar10 = piVar2[(uint)iObj];
  if (iVar10 < 0) {
    piVar2[(uint)iObj] = 0;
    pWVar5 = p->pNtk;
    pWVar7 = pWVar5->vFanins;
    if (pWVar7[(uint)iObj].nSize < 1) {
      iVar10 = 0;
    }
    else {
      iVar10 = 0;
      lVar11 = 0;
      do {
        uVar1 = (p->vFanins).nSize;
        if ((int)uVar1 <= iObj) goto LAB_003650fd;
        piVar3 = (p->vFanins).pArray;
        lVar9 = (long)piVar3[(uint)iObj];
        if ((lVar9 < 0) || (uVar1 <= (uint)piVar3[(uint)iObj])) goto LAB_0036511c;
        iVar4 = piVar3[lVar9 + lVar11 * 2];
        lVar8 = (long)iVar4;
        if (lVar8 != 0) {
          if (pWVar7[lVar8].nSize == 0) {
            if ((iVar4 < 0) || (iVar6 = (pWVar5->vTypes).nSize, iVar6 <= iVar4)) goto LAB_003650fd;
            if ((pWVar5->vTypes).pArray[lVar8] != 3) goto LAB_003650c0;
          }
          else {
            iVar6 = (pWVar5->vTypes).nSize;
          }
          if (iVar6 <= iObj) goto LAB_003650fd;
          if ((lVar11 == 0) || ((pWVar5->vTypes).pArray[(uint)iObj] != 0x59)) {
            if (piVar3[lVar9 + lVar11 * 2 + 1] == 0) {
              iVar4 = Wln_RetPropDelay_rec(p,iVar4);
              if (iVar10 <= iVar4) {
                iVar10 = iVar4;
              }
              piVar2[(uint)iObj] = iVar10;
              pWVar5 = p->pNtk;
            }
            else {
              if (iVar10 < 1) {
                iVar10 = 0;
              }
              piVar2[(uint)iObj] = iVar10;
            }
          }
        }
LAB_003650c0:
        lVar11 = lVar11 + 1;
        pWVar7 = pWVar5->vFanins;
      } while (lVar11 < pWVar7[(uint)iObj].nSize);
    }
    if ((p->vNodeDelays).nSize <= iObj) {
LAB_003650fd:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar10 = iVar10 + (p->vNodeDelays).pArray[(uint)iObj];
    piVar2[(uint)iObj] = iVar10;
  }
  return iVar10;
}

Assistant:

int Wln_RetPropDelay_rec( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, * pDelay = Vec_IntEntryP( &p->vPathDelays, iObj );
    if ( *pDelay >= 0 )
        return *pDelay;
    *pDelay = 0;
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        if ( pLink[0] )
            *pDelay = Abc_MaxInt(*pDelay, 0);
        else
            *pDelay = Abc_MaxInt(*pDelay, Wln_RetPropDelay_rec(p, iFanin));
    }
    *pDelay += Vec_IntEntry( &p->vNodeDelays, iObj );
    return *pDelay;
}